

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_true>_> __thiscall
immutable::rrb_details::concat_sub_tree<int,true,5>
          (rrb_details *this,ref<immutable::rrb_details::tree_node<int,_true>_> *left_node,
          uint32_t left_shift,ref<immutable::rrb_details::tree_node<int,_true>_> *right_node,
          uint32_t right_shift,bool is_top)

{
  uint32_t uVar1;
  ref<immutable::rrb_details::internal_node<int,_true>_> *prVar2;
  internal_node<int,_true> *piVar3;
  leaf_node<int,_true> *plVar4;
  ref<immutable::rrb_details::internal_node<int,_true>_> centre_node;
  ref<immutable::rrb_details::internal_node<int,_true>_> left_internal;
  ref<immutable::rrb_details::tree_node<int,_true>_> left_node_temp;
  ref<immutable::rrb_details::internal_node<int,_true>_> empty;
  ref<immutable::rrb_details::internal_node<int,_true>_> centre_node_2;
  
  if (right_shift < left_shift) {
    left_internal.ptr = (internal_node<int,_true> *)left_node->ptr;
    if (left_internal.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((left_internal.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((left_internal.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    piVar3 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&left_internal);
    prVar2 = piVar3->child;
    piVar3 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&left_internal);
    left_node_temp.ptr = (tree_node<int,_true> *)prVar2[piVar3->len - 1].ptr;
    if ((internal_node<int,_true> *)left_node_temp.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      (((internal_node<int,_true> *)left_node_temp.ptr)->_ref_count).
      super___atomic_base<unsigned_int>._M_i =
           (((internal_node<int,_true> *)left_node_temp.ptr)->_ref_count).
           super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    concat_sub_tree<int,true,5>
              ((rrb_details *)&centre_node,&left_node_temp,left_shift - 5,right_node,right_shift,
               false);
    empty.ptr = (internal_node<int,_true> *)0x0;
    rebalance<int,true,5>(this,&left_internal,&centre_node,&empty,left_shift,is_top);
  }
  else {
    if (right_shift <= left_shift) {
      if (left_shift == 0) {
        left_internal.ptr = (internal_node<int,_true> *)left_node->ptr;
        if (left_internal.ptr != (internal_node<int,_true> *)0x0) {
          LOCK();
          ((left_internal.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
               ((left_internal.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
        }
        left_node_temp = (ref<immutable::rrb_details::tree_node<int,_true>_>)right_node->ptr;
        if (left_node_temp.ptr != (tree_node<int,_true> *)0x0) {
          LOCK();
          ((left_node_temp.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
               ((left_node_temp.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
        }
        if (is_top) {
          plVar4 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&left_internal);
          uVar1 = plVar4->len;
          plVar4 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&left_node_temp)
          ;
          if (uVar1 + plVar4->len < 0x21) {
            centre_node.ptr =
                 (internal_node<int,_true> *)
                 leaf_node_merge<int,true>
                           (left_internal.ptr,(leaf_node<int,_true> *)left_node_temp.ptr);
            if (centre_node.ptr != (internal_node<int,_true> *)0x0) {
              LOCK();
              ((centre_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
              UNLOCK();
            }
            piVar3 = internal_node_new_above1<int,true>(&centre_node);
            *(internal_node<int,_true> **)this = piVar3;
            if (piVar3 != (internal_node<int,_true> *)0x0) {
              LOCK();
              (piVar3->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
              UNLOCK();
            }
            goto LAB_00120eeb;
          }
        }
        centre_node.ptr = (internal_node<int,_true> *)left_node->ptr;
        if (centre_node.ptr != (internal_node<int,_true> *)0x0) {
          LOCK();
          ((centre_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
               ((centre_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
        }
        empty.ptr = (internal_node<int,_true> *)right_node->ptr;
        if (empty.ptr != (internal_node<int,_true> *)0x0) {
          LOCK();
          ((empty.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
               ((empty.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
        }
        piVar3 = internal_node_new_above<int,true>(&centre_node,&empty);
        *(internal_node<int,_true> **)this = piVar3;
        if (piVar3 != (internal_node<int,_true> *)0x0) {
          LOCK();
          (piVar3->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
        }
        ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&empty);
LAB_00120eeb:
        ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&centre_node);
        release<int>((leaf_node<int,_true> *)left_node_temp.ptr);
        release<int>((leaf_node<int,_true> *)left_internal.ptr);
        return (ref<immutable::rrb_details::internal_node<int,_true>_>)
               (internal_node<int,_true> *)this;
      }
      left_internal.ptr = (internal_node<int,_true> *)left_node->ptr;
      if (left_internal.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((left_internal.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((left_internal.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      left_node_temp = (ref<immutable::rrb_details::tree_node<int,_true>_>)right_node->ptr;
      if (left_node_temp.ptr != (tree_node<int,_true> *)0x0) {
        LOCK();
        ((left_node_temp.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((left_node_temp.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      piVar3 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&left_internal);
      prVar2 = piVar3->child;
      piVar3 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&left_internal);
      centre_node.ptr = prVar2[piVar3->len - 1].ptr;
      if (centre_node.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((centre_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((centre_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      piVar3 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&left_node_temp)
      ;
      empty.ptr = piVar3->child->ptr;
      if (empty.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((empty.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((empty.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      concat_sub_tree<int,true,5>
                ((rrb_details *)&centre_node_2,
                 (ref<immutable::rrb_details::tree_node<int,_true>_> *)&centre_node,left_shift - 5,
                 (ref<immutable::rrb_details::tree_node<int,_true>_> *)&empty,right_shift - 5,false)
      ;
      rebalance<int,true,5>
                (this,&left_internal,&centre_node_2,
                 (ref<immutable::rrb_details::internal_node<int,_true>_> *)&left_node_temp,
                 left_shift,is_top);
      ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&centre_node_2);
      ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&empty);
      ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&centre_node);
      ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
                ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&left_node_temp);
      goto LAB_00120d0e;
    }
    left_internal.ptr = (internal_node<int,_true> *)right_node->ptr;
    if (left_internal.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((left_internal.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((left_internal.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    piVar3 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&left_internal);
    left_node_temp.ptr = (tree_node<int,_true> *)piVar3->child->ptr;
    if ((internal_node<int,_true> *)left_node_temp.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      (((internal_node<int,_true> *)left_node_temp.ptr)->_ref_count).
      super___atomic_base<unsigned_int>._M_i =
           (((internal_node<int,_true> *)left_node_temp.ptr)->_ref_count).
           super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    concat_sub_tree<int,true,5>
              ((rrb_details *)&centre_node,left_node,left_shift,&left_node_temp,right_shift - 5,
               false);
    empty.ptr = (internal_node<int,_true> *)0x0;
    rebalance<int,true,5>(this,&empty,&centre_node,&left_internal,right_shift,is_top);
  }
  ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&empty);
  ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&centre_node);
  ref<immutable::rrb_details::tree_node<int,_true>_>::~ref(&left_node_temp);
LAB_00120d0e:
  ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&left_internal);
  return (ref<immutable::rrb_details::internal_node<int,_true>_>)(internal_node<int,_true> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> concat_sub_tree(const ref<tree_node<T, atomic_ref_counting>>& left_node, uint32_t left_shift, const ref<tree_node<T, atomic_ref_counting>>& right_node, uint32_t right_shift, bool is_top)
      {
      if (left_shift > right_shift)
        {
        // Left tree is higher than right tree
        ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
        ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node, right_shift, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, empty, left_shift, is_top);
        }
      else if (left_shift < right_shift)
        {
        ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
        ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node, left_shift, right_node_temp, right_shift - bits<N>::rrb_bits, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(empty, centre_node, right_internal, right_shift, is_top);
        }
      else
        { // we have same height
        if (left_shift == 0)
          { // We're dealing with leaf nodes
          ref<leaf_node<T, atomic_ref_counting>> left_leaf = left_node;
          ref<leaf_node<T, atomic_ref_counting>> right_leaf = right_node;
          // We don't do this if we're not at top, as we'd have to zip stuff above
          // as well.
          if (is_top && (left_leaf->len + right_leaf->len) <= bits<N>::rrb_branching)
            {
            // Can put them in a single node
            ref<internal_node<T, atomic_ref_counting>> merged = leaf_node_merge<T, atomic_ref_counting>(left_leaf.ptr, right_leaf.ptr);
            return internal_node_new_above1(merged);
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
            ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
            return internal_node_new_above(left_internal, right_internal);
            }
          }
        else
          { // two internal nodes with same height. Move both down
          ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
          ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
          ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
          ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
          ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node_temp, right_shift - bits<N>::rrb_bits, false);
          // can be optimised: since left_shift == right_shift, we'll end up in this
          // block again.
          return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, right_internal, left_shift, is_top);
          }
        }
      }